

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

TValue * ffi_clib_index(lua_State *L)

{
  CTypeID CVar1;
  CType *in_RAX;
  TValue *pTVar2;
  long lVar3;
  void *pvVar4;
  CTState *cts;
  ulong uVar5;
  GCstr *key;
  lua_Number lVar6;
  CType *local_38;
  
  pTVar2 = L->base;
  if (((pTVar2 < L->top) && ((pTVar2->field_2).it == 0xfffffff3)) &&
     (uVar5 = (ulong)(pTVar2->u32).lo, *(char *)(uVar5 + 6) == '\x02')) {
    if ((pTVar2 + 1 < L->top) && (*(int *)((long)pTVar2 + 0xc) == -5)) {
      key = (GCstr *)(ulong)pTVar2[1].u32.lo;
      local_38 = in_RAX;
      pTVar2 = lj_tab_setstr(L,*(GCtab **)(uVar5 + 0x20),key);
      if ((pTVar2->field_2).it == 0xffffffff) {
        cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
        cts->L = L;
        CVar1 = lj_ctype_getname(cts,&local_38,key,0x1840);
        if (CVar1 == 0) {
          lj_err_callerv(L,LJ_ERR_FFI_NODECL,key + 1);
        }
        if ((local_38->info & 0xf0000000) == 0xb0000000) {
          if (((*(byte *)((long)&cts->tab->info + (ulong)((local_38->info & 0xffff) << 4) + 2) &
               0x80) == 0) || (-1 < (int)local_38->size)) {
            lVar6 = (lua_Number)(int)local_38->size;
          }
          else {
            lVar6 = (lua_Number)local_38->size;
          }
          pTVar2->n = lVar6;
        }
        else {
          lVar3 = dlsym(*(undefined8 *)(uVar5 + 0x18));
          if (lVar3 == 0) {
            clib_error_(L);
          }
          pvVar4 = lj_mem_newgco(cts->L,0x10);
          *(undefined1 *)((long)pvVar4 + 5) = 10;
          *(short *)((long)pvVar4 + 6) = (short)CVar1;
          *(long *)((long)pvVar4 + 8) = lVar3;
          (pTVar2->u32).lo = (uint32_t)pvVar4;
          (pTVar2->field_2).it = 0xfffffff5;
        }
      }
      return pTVar2;
    }
    lj_err_argt(L,2,4);
  }
  lj_err_argt(L,1,7);
}

Assistant:

static TValue *ffi_clib_index(lua_State *L)
{
  TValue *o = L->base;
  CLibrary *cl;
  if (!(o < L->top && tvisudata(o) && udataV(o)->udtype == UDTYPE_FFI_CLIB))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  cl = (CLibrary *)uddata(udataV(o));
  if (!(o+1 < L->top && tvisstr(o+1)))
    lj_err_argt(L, 2, LUA_TSTRING);
  return lj_clib_index(L, cl, strV(o+1));
}